

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::InsertOneLoopProbe(Lowerer *this,Instr *insertInstr,LabelInstr *loopLabel)

{
  RegNum reg;
  int iVar1;
  undefined4 extraout_var;
  MemRefOpnd *compareSrc2;
  RegOpnd *compareSrc1;
  LabelInstr *pLVar2;
  HelperCallOpnd *newSrc;
  Instr *pIVar3;
  BranchInstr *instr;
  Lowerer *this_00;
  
  iVar1 = (*this->m_func->m_threadContextInfo->_vptr_ThreadContextInfo[3])();
  compareSrc2 = IR::MemRefOpnd::New(CONCAT44(extraout_var,iVar1),TyInt64,this->m_func,
                                    AddrOpndKindDynamicMisc);
  reg = LowererMDArch::GetRegStackPointer();
  this_00 = (Lowerer *)0x0;
  compareSrc1 = IR::RegOpnd::New((StackSym *)0x0,reg,TyInt64,this->m_func);
  InsertCompareBranch(this_00,&compareSrc1->super_Opnd,&compareSrc2->super_Opnd,BrGt_A,loopLabel,
                      insertInstr,false);
  pLVar2 = IR::LabelInstr::New(Label,this->m_func,true);
  IR::Instr::InsertBefore(insertInstr,&pLVar2->super_Instr);
  newSrc = IR::HelperCallOpnd::New(HelperScriptAbort,this->m_func);
  pIVar3 = IR::Instr::New(Call,this->m_func);
  IR::Instr::SetSrc1(pIVar3,&newSrc->super_Opnd);
  IR::Instr::InsertBefore(insertInstr,pIVar3);
  LowererMD::LowerCall(&this->m_lowererMD,pIVar3,0);
  pIVar3 = IR::Instr::GetPrevRealInstrOrLabel(this->m_func->m_exitInstr);
  if ((pIVar3->m_kind == InstrKindProfiledLabel) || (pIVar3->m_kind == InstrKindLabel)) {
    pLVar2 = IR::Instr::AsLabelInstr(pIVar3);
  }
  else {
    pLVar2 = IR::LabelInstr::New(Label,this->m_func,false);
    IR::Instr::InsertBefore(this->m_func->m_exitInstr,&pLVar2->super_Instr);
  }
  instr = IR::BranchInstr::New(JMP,pLVar2,this->m_func);
  IR::Instr::InsertBefore(insertInstr,&instr->super_Instr);
  return;
}

Assistant:

void
Lowerer::InsertOneLoopProbe(IR::Instr *insertInstr, IR::LabelInstr *loopLabel)
{
    // Insert one interrupt probe at the given instruction. Probe the stack and call the abort helper
    // directly if the probe fails.

    IR::Opnd *memRefOpnd = IR::MemRefOpnd::New(
        m_func->GetThreadContextInfo()->GetThreadStackLimitAddr(),
        TyMachReg, this->m_func);

    IR::RegOpnd *regStackPointer = IR::RegOpnd::New(
        NULL, this->m_lowererMD.GetRegStackPointer(), TyMachReg, this->m_func);

    InsertCompareBranch(regStackPointer, memRefOpnd, Js::OpCode::BrGt_A, loopLabel, insertInstr);

    IR::LabelInstr *helperLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    insertInstr->InsertBefore(helperLabel);

    IR::HelperCallOpnd *helperOpnd = IR::HelperCallOpnd::New(IR::HelperScriptAbort, this->m_func);
    IR::Instr *instr = IR::Instr::New(Js::OpCode::Call, this->m_func);
    instr->SetSrc1(helperOpnd);
    insertInstr->InsertBefore(instr);
    this->m_lowererMD.LowerCall(instr, 0);

    // Jump to the exit after the helper call. This instruction will never be reached, but the jump
    // indicates that nothing is live after the call (to avoid useless spills in code that will
    // be executed).
    instr = this->m_func->m_exitInstr->GetPrevRealInstrOrLabel();
    if (instr->IsLabelInstr())
    {
        helperLabel = instr->AsLabelInstr();
    }
    else
    {
        helperLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        this->m_func->m_exitInstr->InsertBefore(helperLabel);
    }

    instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, helperLabel, this->m_func);
    insertInstr->InsertBefore(instr);
}